

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall
dxil_spv::CFGNode::can_backtrace_to_with_blockers
          (CFGNode *this,CFGNode *parent,Vector<CFGNode_*> *block_nodes,
          UnorderedSet<const_CFGNode_*> *node_cache)

{
  pointer ppCVar1;
  bool bVar2;
  size_type sVar3;
  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var4;
  __hashtable *__h;
  CFGNode *this_00;
  pointer ppCVar5;
  bool bVar6;
  __node_gen_type __node_gen;
  CFGNode *local_40;
  CFGNode *local_38;
  
  local_40 = this;
  sVar3 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&node_cache->_M_h,&local_40);
  if (sVar3 == 0) {
    local_40 = (CFGNode *)node_cache;
    local_38 = this;
    std::
    _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<dxil_spv::CFGNode_const*,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
              ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)node_cache,&local_38,&local_40);
    local_40 = this;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode_const*const>>
                      ((block_nodes->
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (block_nodes->
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&local_40);
    if (_Var4._M_current ==
        (block_nodes->
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      ppCVar5 = (this->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (this->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = ppCVar5 != ppCVar1;
      if (!bVar6) {
        return bVar6;
      }
      this_00 = *ppCVar5;
      if (this_00 == parent) {
        return bVar6;
      }
      while( true ) {
        ppCVar5 = ppCVar5 + 1;
        bVar2 = can_backtrace_to_with_blockers(this_00,parent,block_nodes,node_cache);
        if (bVar2) {
          return bVar6;
        }
        bVar6 = ppCVar5 != ppCVar1;
        if (ppCVar5 == ppCVar1) break;
        this_00 = *ppCVar5;
        if (this_00 == parent) {
          return bVar6;
        }
      }
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool CFGNode::can_backtrace_to_with_blockers(const CFGNode *parent, const Vector<CFGNode *> &block_nodes,
                                             UnorderedSet<const CFGNode *> &node_cache) const
{
	if (node_cache.count(this))
		return false;
	node_cache.insert(this);

	if (std::find(block_nodes.begin(), block_nodes.end(), this) != block_nodes.end())
		return false;

	for (auto *p : pred)
		if (p == parent || p->can_backtrace_to_with_blockers(parent, block_nodes, node_cache))
			return true;

	return false;
}